

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O3

void doFormatString<unsigned_char_const>(wstringstream *stream,wchar_t *format,uchar *first)

{
  wchar_t wVar1;
  bool bVar2;
  wchar_t *pwVar3;
  wchar_t local_34;
  wchar_t *local_30;
  
  pwVar3 = format + 1;
  while( true ) {
    wVar1 = pwVar3[-1];
    if (wVar1 == L'\0') {
      return;
    }
    local_30 = pwVar3;
    if (wVar1 == L'%') break;
    local_34 = wVar1;
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
              ((wostream *)(stream + 0x10),&local_34,1);
    pwVar3 = pwVar3 + 1;
  }
  bVar2 = doFormatSetup(stream,&local_30);
  if (bVar2) {
    std::wostream::operator<<((wostream *)(stream + 0x10),(uint)*first);
  }
  doFormatString(stream,local_30);
  return;
}

Assistant:

void doFormatString(std::wstringstream& stream, const wchar_t* format, First& first, const Rest&... rest)
{
	while (*format != 0)
	{
		if (*format == '%')
		{
			format++;
			if (doFormatSetup(stream,format))
				stream << first;
			doFormatString(stream,format,rest...);
			return;
		}

		stream << *format++;
	}
}